

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_host.c
# Opt level: O0

function_interface function_host_singleton(void)

{
  return &function_host_singleton::host_interface;
}

Assistant:

function_interface function_host_singleton(void)
{
	static struct function_interface_type host_interface = {
		NULL,
		&function_host_interface_invoke,
		&function_host_interface_await,
		NULL
	};

	return &host_interface;
}